

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

int AF_A_WeaponReady(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  player_t *ppVar3;
  bool bVar4;
  PClass *pPVar5;
  int iVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  ushort uVar8;
  uint uVar9;
  AActor *self;
  uint uVar10;
  uint paramflags;
  VMValue *pVVar11;
  char *__assertion;
  bool bVar12;
  bool bVar13;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00559431;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self == (AActor *)0x0) {
LAB_0055924a:
        bVar4 = true;
        self = (AActor *)0x0;
        pVVar11 = param;
        uVar9 = numparam;
      }
      else {
        pPVar7 = (self->super_DThinker).super_DObject.Class;
        if (pPVar7 == (PClass *)0x0) {
          iVar6 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
          pPVar7 = (PClass *)CONCAT44(extraout_var,iVar6);
          (self->super_DThinker).super_DObject.Class = pPVar7;
        }
        bVar12 = pPVar7 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar12;
        bVar13 = pPVar7 == pPVar5;
        if (!bVar13 && !bVar12) {
          do {
            pPVar7 = pPVar7->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
            if (pPVar7 == pPVar5) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00559431;
        }
        bVar4 = false;
        pVVar11 = (VMValue *)(ulong)(bVar13 || bVar12);
        uVar9 = (uint)bVar12;
      }
      pPVar5 = AActor::RegistrationInfo.MyClass;
      uVar10 = 0;
      paramflags = 0;
      if (numparam == 1) goto LAB_0055935b;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0055940f;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar7 = (PClass *)puVar2[1];
            if (pPVar7 == (PClass *)0x0) {
              pPVar7 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar11,uVar9,ret);
              puVar2[1] = pPVar7;
            }
            bVar12 = pPVar7 != (PClass *)0x0;
            if (pPVar7 != pPVar5 && bVar12) {
              do {
                pPVar7 = pPVar7->ParentClass;
                bVar12 = pPVar7 != (PClass *)0x0;
                if (pPVar7 == pPVar5) break;
              } while (pPVar7 != (PClass *)0x0);
            }
            if (!bVar12) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00559431;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_0055940f;
      }
      paramflags = uVar10;
      if (numparam < 3) {
LAB_0055935b:
        if ((!bVar4) && (ppVar3 = self->player, ppVar3 != (player_t *)0x0)) {
          uVar8 = ppVar3->WeaponState & 0xff7f;
          if ((paramflags & 2) == 0) {
            uVar8 = ppVar3->WeaponState | 0x88;
          }
          ppVar3->WeaponState = uVar8;
        }
        if ((~paramflags & 0xc) != 0) {
          DoReadyWeaponToFire(self,(paramflags & 4) == 0,(paramflags & 8) == 0);
        }
        if ((paramflags & 1) == 0) {
          DoReadyWeaponToBob(self);
        }
        DoReadyWeaponToGeneric(self,paramflags);
        if ((!bVar4) && (ppVar3 = self->player, ppVar3 != (player_t *)0x0)) {
          uVar8 = ppVar3->WeaponState & 0xffef;
          if ((paramflags & 0x40) != 0) {
            uVar8 = ppVar3->WeaponState & 0xff6f | 0x10;
          }
          ppVar3->WeaponState = uVar8;
        }
        return 0;
      }
      VVar1 = param[2].field_0.field_3.Type;
      if ((VVar1 == 0xff) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
        if (numparam != 3) {
          VVar1 = param[3].field_0.field_3.Type;
          if (VVar1 == '\0') {
            paramflags = param[3].field_0.i;
          }
          else if (VVar1 != 0xff) {
            __assert_fail("param[paramnum].Type == REGT_INT",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                          ,0x2e8,
                          "int AF_A_WeaponReady(VMFrameStack *, VMValue *, int, VMReturn *, int)");
          }
        }
        goto LAB_0055935b;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00559431;
    }
    if (self == (AActor *)0x0) goto LAB_0055924a;
  }
LAB_0055940f:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00559431:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x2e7,"int AF_A_WeaponReady(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AInventory, A_WeaponReady)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT_OPT(flags)	{ flags = 0; }

													DoReadyWeaponToSwitch(self, !(flags & WRF_NoSwitch));
	if ((flags & WRF_NoFire) != WRF_NoFire)			DoReadyWeaponToFire(self, !(flags & WRF_NoPrimary), !(flags & WRF_NoSecondary));
	if (!(flags & WRF_NoBob))						DoReadyWeaponToBob(self);
													DoReadyWeaponToGeneric(self, flags);
	DoReadyWeaponDisableSwitch(self, flags & WRF_DisableSwitch);
	return 0;
}